

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcShapeModel::~IfcShapeModel(IfcShapeModel *this)

{
  _func_int *p_Var1;
  void *pvVar2;
  long *plVar3;
  long *plVar4;
  
  p_Var1 = (this->super_IfcRepresentation).
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>._vptr_ObjectHelper
           [-3];
  *(undefined8 *)
   ((long)&(this->super_IfcRepresentation).
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>._vptr_ObjectHelper +
   (long)p_Var1) = 0x8d4db0;
  *(undefined8 *)(&(this->super_IfcRepresentation).field_0x90 + (long)p_Var1) = 0x8d4dd8;
  pvVar2 = *(void **)(p_Var1 + (long)&(this->super_IfcRepresentation).Items.
                                      super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                                      .
                                      super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                     );
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)(p_Var1 + 0x10 +
                                    (long)&(this->super_IfcRepresentation).Items.
                                           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                                           .
                                           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                                    ) - (long)pvVar2);
  }
  if (*(code **)(p_Var1 + (long)&(this->super_IfcRepresentation).RepresentationType.ptr._M_dataplus)
      != p_Var1 + 0x10 + (long)&(this->super_IfcRepresentation).RepresentationType.ptr._M_dataplus)
  {
    operator_delete(*(code **)(p_Var1 + (long)&(this->super_IfcRepresentation).RepresentationType.
                                               ptr._M_dataplus),
                    *(long *)(p_Var1 + 0x10 +
                             (long)&(this->super_IfcRepresentation).RepresentationType.ptr.
                                    _M_dataplus) + 1);
  }
  plVar3 = *(long **)(&(this->super_IfcRepresentation).
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.
                       field_0x18 + (long)p_Var1);
  plVar4 = (long *)(&(this->super_IfcRepresentation).field_0x28 + (long)p_Var1);
  if (plVar3 != plVar4) {
    operator_delete(plVar3,*plVar4 + 1);
    return;
  }
  return;
}

Assistant:

IfcShapeModel() : Object("IfcShapeModel") {}